

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

void __thiscall iDynTree::SimpleLeggedOdometry::SimpleLeggedOdometry(SimpleLeggedOdometry *this)

{
  Model *in_RDI;
  
  iDynTree::Model::Model(in_RDI);
  iDynTree::Traversal::Traversal((Traversal *)(in_RDI + 0x130));
  in_RDI[400] = (Model)0x0;
  in_RDI[0x191] = (Model)0x0;
  in_RDI[0x192] = (Model)0x0;
  *(undefined8 *)(in_RDI + 0x198) = LINK_INVALID_INDEX;
  iDynTree::LinkPositions::LinkPositions((LinkPositions *)(in_RDI + 0x1a0),0);
  iDynTree::Transform::Identity();
  return;
}

Assistant:

SimpleLeggedOdometry::SimpleLeggedOdometry(): m_model(),
                                              m_traversal(),
                                              m_isModelValid(false),
                                              m_kinematicsUpdated(false),
                                              m_isOdometryInitialized(false),
                                              m_fixedLinkIndex(iDynTree::LINK_INVALID_INDEX),
                                              m_world_H_fixedLink(Transform::Identity())
{
}